

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O1

sljit_s32 emit_load_imm64(sljit_compiler *compiler,sljit_s32 reg,sljit_sw imm)

{
  sljit_s32 sVar1;
  undefined1 *puVar2;
  
  puVar2 = (undefined1 *)ensure_buf(compiler,0xb);
  if (puVar2 == (undefined1 *)0x0) {
    sVar1 = compiler->error;
  }
  else {
    *puVar2 = 10;
    compiler->size = compiler->size + 10;
    puVar2[1] = (0xe21fUL >> ((long)reg & 0x3fU) & 1) != 0 ^ 0x49;
    puVar2[2] = ""[reg] & 7 | 0xb8;
    *(sljit_sw *)(puVar2 + 3) = imm;
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

static sljit_s32 emit_load_imm64(struct sljit_compiler *compiler, sljit_s32 reg, sljit_sw imm)
{
	sljit_u8 *inst;

	inst = (sljit_u8*)ensure_buf(compiler, 1 + 2 + sizeof(sljit_sw));
	FAIL_IF(!inst);
	INC_SIZE(2 + sizeof(sljit_sw));
	*inst++ = REX_W | ((reg_map[reg] <= 7) ? 0 : REX_B);
	*inst++ = MOV_r_i32 + (reg_map[reg] & 0x7);
	sljit_unaligned_store_sw(inst, imm);
	return SLJIT_SUCCESS;
}